

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortDnaSequence.cpp
# Opt level: O1

double __thiscall ShortDnaSequence::qualityCorrect(ShortDnaSequence *this,size_t pos)

{
  element_type *peVar1;
  double dVar2;
  
  peVar1 = (this->forward_qualities).px;
  if (pos < peVar1->_M_string_length) {
    dVar2 = pow(10.0,(double)(0x21 - (peVar1->_M_dataplus)._M_p[pos]) / 10.0);
    return 1.0 - dVar2;
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

double ShortDnaSequence::qualityCorrect(size_t pos) const {
    return 1 - pow(10, -(qualityChar(pos)-33)/10.0);
}